

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_minelements(lysp_yang_ctx *ctx,uint32_t *min,uint16_t *flags,lysp_ext_instance **exts)

{
  ushort **ppuVar1;
  int *piVar2;
  char *pcVar3;
  ly_ctx *local_a0;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  bool local_65;
  ly_stmt local_64;
  ly_bool __loop_end;
  ulonglong uStack_60;
  ly_stmt kw;
  unsigned_long_long num;
  size_t word_len;
  char *ptr;
  char *word;
  char *buf;
  lysp_ext_instance **pplStack_30;
  LY_ERR ret;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  uint32_t *min_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  word = (char *)0x0;
  pplStack_30 = exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)min;
  min_local = &ctx->format;
  if ((*flags & 0x200) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","min-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  buf._4_4_ = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&ptr,&word,&num);
  if (buf._4_4_ == LY_SUCCESS) {
    if (((num == 0) || (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*ptr] & 0x800) == 0)) ||
       ((*ptr == '0' && (1 < num)))) {
      if (min_local == (uint32_t *)0x0) {
        local_78 = (ly_ctx *)0x0;
      }
      else {
        local_78 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)(min_local + 0xe) + 8) +
                      (ulong)(*(int *)(*(long *)(min_local + 0xe) + 4) - 1) * 8);
      }
      ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              num & 0xffffffff,ptr,"min-elements");
      buf._4_4_ = LY_EVALID;
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0;
      uStack_60 = strtoull(ptr,(char **)&word_len,10);
      if (word_len - (long)ptr == num) {
        piVar2 = __errno_location();
        if ((*piVar2 == 0x22) || (0xffffffff < uStack_60)) {
          if (min_local == (uint32_t *)0x0) {
            local_88 = (ly_ctx *)0x0;
          }
          else {
            local_88 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(*(long *)(min_local + 0xe) + 8) +
                          (ulong)(*(int *)(*(long *)(min_local + 0xe) + 4) - 1) * 8);
          }
          ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                  num & 0xffffffff,ptr,"min-elements");
          buf._4_4_ = LY_EVALID;
        }
        else {
          *(int *)flags_local = (int)uStack_60;
          buf._4_4_ = get_keyword((lysp_yang_ctx *)min_local,&local_64,&ptr,&num);
          if (buf._4_4_ == LY_SUCCESS) {
            if (local_64 == LY_STMT_SYNTAX_SEMICOLON) {
              local_65 = true;
            }
            else {
              if (local_64 != LY_STMT_SYNTAX_LEFT_BRACE) {
                if (min_local == (uint32_t *)0x0) {
                  local_90 = (ly_ctx *)0x0;
                }
                else {
                  local_90 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(*(long *)(min_local + 0xe) + 8) +
                                (ulong)(*(int *)(*(long *)(min_local + 0xe) + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(local_64);
                ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
                buf._4_4_ = LY_EVALID;
                goto LAB_001c1103;
              }
              buf._4_4_ = get_keyword((lysp_yang_ctx *)min_local,&local_64,&ptr,&num);
              if (buf._4_4_ != LY_SUCCESS) goto LAB_001c1103;
              local_65 = local_64 == LY_STMT_SYNTAX_RIGHT_BRACE;
            }
            while (!local_65) {
              if (local_64 != LY_STMT_EXTENSION_INSTANCE) {
                if (min_local == (uint32_t *)0x0) {
                  local_a0 = (ly_ctx *)0x0;
                }
                else {
                  local_a0 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(*(long *)(min_local + 0xe) + 8) +
                                (ulong)(*(int *)(*(long *)(min_local + 0xe) + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(local_64);
                ly_vlog(local_a0,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"min-elements");
                buf._4_4_ = LY_EVALID;
                break;
              }
              buf._4_4_ = parse_ext((lysp_yang_ctx *)min_local,ptr,num,flags_local,
                                    LY_STMT_MIN_ELEMENTS,0,pplStack_30);
              if ((buf._4_4_ != LY_SUCCESS) ||
                 (buf._4_4_ = get_keyword((lysp_yang_ctx *)min_local,&local_64,&ptr,&num),
                 buf._4_4_ != LY_SUCCESS)) break;
              if (local_64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
                local_65 = true;
              }
            }
          }
        }
      }
      else {
        if (min_local == (uint32_t *)0x0) {
          local_80 = (ly_ctx *)0x0;
        }
        else {
          local_80 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(*(long *)(min_local + 0xe) + 8) +
                        (ulong)(*(int *)(*(long *)(min_local + 0xe) + 4) - 1) * 8);
        }
        ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                num & 0xffffffff,ptr,"min-elements");
        buf._4_4_ = LY_EVALID;
      }
    }
  }
LAB_001c1103:
  free(word);
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_minelements(struct lysp_yang_ctx *ctx, uint32_t *min, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (*flags & LYS_SET_MIN) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "min-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MIN;

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || !isdigit(word[0]) || ((word[0] == '0') && (word_len > 1))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    num = strtoull(word, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }
    if ((errno == ERANGE) || (num > UINT32_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }
    *min = num;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, min, LY_STMT_MIN_ELEMENTS, 0, exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "min-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}